

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:471:54)>
::getImpl(SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:471:54)>
          *this,ExceptionOrValue *output)

{
  ExceptionOr<kj::_::Void> depResult;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 local_360;
  ExceptionOr<kj::Promise<unsigned_long>_> local_358;
  NullableValue<kj::Exception> local_1b0;
  char local_18;
  
  local_1b0.isSet = false;
  local_18 = '\0';
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)&local_1b0);
  if (local_1b0.isSet == true) {
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&local_358,&local_1b0.field_1.value);
    local_358.value.ptr.isSet = false;
    ExceptionOr<kj::Promise<unsigned_long>_>::operator=
              ((ExceptionOr<kj::Promise<unsigned_long>_> *)output,&local_358);
    ExceptionOr<kj::Promise<unsigned_long>_>::~ExceptionOr(&local_358);
  }
  else if (local_18 == '\x01') {
    anon_class_16_2_40a49b79_for_func::operator()
              ((anon_class_16_2_40a49b79_for_func *)&local_360.value);
    local_358.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_358.value.ptr.isSet = true;
    local_358.value.ptr.field_1 = local_360;
    local_360 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2)0x0;
    ExceptionOr<kj::Promise<unsigned_long>_>::operator=
              ((ExceptionOr<kj::Promise<unsigned_long>_> *)output,&local_358);
    ExceptionOr<kj::Promise<unsigned_long>_>::~ExceptionOr(&local_358);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_360.value);
  }
  NullableValue<kj::Exception>::~NullableValue(&local_1b0);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }